

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

Reg ra_restore(ASMState *as,IRRef ref)

{
  IRIns *ir;
  byte bVar1;
  Reg RVar2;
  int32_t ofs;
  uint uVar3;
  
  if (ref < 0x8001) {
    RVar2 = ra_rematk(as,ref);
    return RVar2;
  }
  ir = as->ir + ref;
  ofs = ra_spill(as,ir);
  bVar1 = (ir->field_1).r;
  uVar3 = 1 << (bVar1 & 0x1f);
  (ir->field_1).r = bVar1 | 0x80;
  as->freeset = as->freeset | uVar3;
  if ((as->weakset >> (bVar1 & 0x1f) & 1) == 0) {
    as->modset = as->modset | uVar3;
    emit_loadofs(as,ir,(uint)bVar1,4,ofs);
  }
  return (uint)bVar1;
}

Assistant:

static Reg ra_restore(ASMState *as, IRRef ref)
{
  if (emit_canremat(ref)) {
    return ra_rematk(as, ref);
  } else {
    IRIns *ir = IR(ref);
    int32_t ofs = ra_spill(as, ir);  /* Force a spill slot. */
    Reg r = ir->r;
    lj_assertA(ra_hasreg(r), "restore of IR %04d has no reg", ref - REF_BIAS);
    ra_sethint(ir->r, r);  /* Keep hint. */
    ra_free(as, r);
    if (!rset_test(as->weakset, r)) {  /* Only restore non-weak references. */
      ra_modified(as, r);
      RA_DBGX((as, "restore   $i $r", ir, r));
      emit_spload(as, ir, r, ofs);
    }
    return r;
  }
}